

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_layout_helper.cc
# Opt level: O3

FieldAlignmentGroups * __thiscall
google::protobuf::compiler::cpp::MessageLayoutHelper::BuildFieldAlignmentGroups
          (FieldAlignmentGroups *__return_storage_ptr__,MessageLayoutHelper *this,
          FieldVector *fields,Options *options,MessageSCCAnalyzer *scc_analyzer)

{
  byte bVar1;
  FieldDescriptor *field;
  char *pcVar2;
  bool bVar3;
  FieldFamily FVar4;
  uint uVar5;
  int iVar6;
  Nonnull<const_char_*> failure_msg;
  LogMessage *pLVar7;
  FieldAlignmentGroups *pFVar8;
  pointer ppFVar9;
  ulong uVar10;
  string_view str;
  string_view str_00;
  string_view v;
  FieldGroup fg;
  vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
  fast_path_fields;
  LogMessage local_98;
  FieldAlignmentGroups *local_88;
  FieldAlignmentGroups *local_80;
  pointer local_78;
  value_type local_70;
  vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
  local_50;
  int local_34;
  
  memset(__return_storage_ptr__,0,0x870);
  BuildFastParseTable(&local_50,this,options,scc_analyzer);
  ppFVar9 = (fields->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_78 = (fields->
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar9 != local_78) {
    local_88 = (FieldAlignmentGroups *)&__return_storage_ptr__->aligned_to_8;
    local_80 = (FieldAlignmentGroups *)&__return_storage_ptr__->aligned_to_4;
    do {
      field = *ppFVar9;
      FVar4 = GetFieldFamily(field,options,scc_analyzer);
      bVar3 = ShouldSplit(field,options);
      if (bVar3) {
        uVar10 = 0;
      }
      else {
        bVar1 = field->field_0x1;
        bVar3 = (bool)((bVar1 & 0x20) >> 5);
        if (0xbf < bVar1 != bVar3) {
          failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar3,0xbf < bVar1,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_70,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,failure_msg);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_70);
        }
        uVar10 = 5;
        if ((bVar1 & 0x20) == 0) {
          uVar5 = (*this->_vptr_MessageLayoutHelper[4])(this,field,options,scc_analyzer);
          uVar10 = 1;
          if (uVar5 != 1) {
            bVar3 = IsFastPathField(field,&local_50);
            uVar10 = (ulong)uVar5;
            if (bVar3) {
              uVar10 = 4;
            }
          }
        }
      }
      (*this->_vptr_MessageLayoutHelper[5])(&local_70,this,field);
      iVar6 = EstimateAlignmentSize(field);
      pFVar8 = __return_storage_ptr__;
      if (((iVar6 != 1) && (pFVar8 = local_80, iVar6 != 4)) && (pFVar8 = local_88, iVar6 != 8)) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_98,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message_layout_helper.cc"
                   ,0xa4);
        str._M_str = "Unknown alignment size ";
        str._M_len = 0x17;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (&local_98,str);
        local_34 = EstimateAlignmentSize(field);
        pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>
                           (&local_98,&local_34);
        str_00._M_str = "for field ";
        str_00._M_len = 10;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (pLVar7,str_00);
        pcVar2 = (field->all_names_).payload_;
        v._M_len = (ulong)*(ushort *)(pcVar2 + 2);
        v._M_str = pcVar2 + ~v._M_len;
        pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar7,v);
        absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar7,(char (*) [2])0x6790d8);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_98);
      }
      std::
      vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
      ::push_back((vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
                   *)(&(pFVar8->aligned_to_1)._M_elems[0].field_0x0 +
                     uVar10 * 0x18 + (ulong)(FVar4 * 0x90)),&local_70);
      if (local_70.fields_.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70.fields_.
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_70.fields_.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_70.fields_.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      ppFVar9 = ppFVar9 + 1;
    } while (ppFVar9 != local_78);
  }
  if (local_50.
      super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

MessageLayoutHelper::FieldAlignmentGroups
MessageLayoutHelper::BuildFieldAlignmentGroups(
    const FieldVector& fields, const Options& options,
    MessageSCCAnalyzer* scc_analyzer) const {
  FieldAlignmentGroups field_alignment_groups;
  const auto fast_path_fields = BuildFastParseTable(options, scc_analyzer);

  for (const auto* field : fields) {
    FieldFamily f = GetFieldFamily(field, options, scc_analyzer);

    FieldHotness hotness;
    if (ShouldSplit(field, options)) {
      hotness = kSplit;
    } else if (field->is_repeated()) {
      hotness = kRepeated;
    } else {
      hotness = GetFieldHotness(field, options, scc_analyzer);

      if (hotness != kCold && IsFastPathField(field, fast_path_fields)) {
        hotness = kFastParse;
      }
    }

    FieldGroup fg = SingleFieldGroup(field);
    switch (EstimateAlignmentSize(field)) {
      case 1:
        field_alignment_groups.aligned_to_1[f][hotness].push_back(fg);
        break;
      case 4:
        field_alignment_groups.aligned_to_4[f][hotness].push_back(fg);
        break;
      case 8:
        field_alignment_groups.aligned_to_8[f][hotness].push_back(fg);
        break;
      default:
        ABSL_LOG(FATAL) << "Unknown alignment size "
                        << EstimateAlignmentSize(field) << "for field "
                        << field->full_name() << ".";
    }
  }

  return field_alignment_groups;
}